

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_deserialize(void *buf)

{
  uint32_t *elems;
  uint32_t card;
  char *bufaschar;
  void *buf_local;
  
  if (*buf == '\x01') {
    buf_local = roaring_bitmap_of_ptr((ulong)*(uint *)((long)buf + 1),(uint32_t *)((long)buf + 5));
  }
  else if (*buf == '\x02') {
    buf_local = roaring_bitmap_portable_deserialize((char *)((long)buf + 1));
  }
  else {
    buf_local = (void *)0x0;
  }
  return (roaring_bitmap_t *)buf_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_deserialize(const void *buf) {
    const char *bufaschar = (const char *)buf;
    if (*(const unsigned char *)buf == SERIALIZATION_ARRAY_UINT32) {
        /* This looks like a compressed set of uint32_t elements */
        uint32_t card;
        memcpy(&card, bufaschar + 1, sizeof(uint32_t));
        const uint32_t *elems =
            (const uint32_t *)(bufaschar + 1 + sizeof(uint32_t));

        return roaring_bitmap_of_ptr(card, elems);
    } else if (bufaschar[0] == SERIALIZATION_CONTAINER) {
        return roaring_bitmap_portable_deserialize(bufaschar + 1);
    } else
        return (NULL);
}